

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::block_is_loop_candidate(Compiler *this,SPIRBlock *block,Method method)

{
  uint32_t uVar1;
  uint32_t uVar2;
  SPIRBlock *pSVar3;
  SPIRBlock *pSVar4;
  SPIRBlock *pSVar5;
  Phi *pPVar6;
  SPIRBlock *to;
  bool local_156;
  bool local_155;
  bool local_149;
  bool local_13e;
  bool local_13d;
  bool local_136;
  bool local_135;
  bool local_12e;
  bool local_12d;
  bool local_11a;
  bool local_119;
  bool local_10d;
  bool local_102;
  bool local_101;
  bool local_fa;
  bool local_f9;
  bool local_f1;
  Phi *phi_2;
  Phi *__end5;
  Phi *__begin5;
  SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *__range5;
  SPIRBlock *merge_1;
  bool negative_candidate_1;
  bool positive_candidate_1;
  bool true_block_is_merge_1;
  bool false_block_is_merge_1;
  SPIRBlock *merge_block_1;
  SPIRBlock *true_block_1;
  SPIRBlock *false_block_1;
  SPIRBlock *child;
  bool ret_1;
  Phi *phi_1;
  Phi *__end4;
  Phi *__begin4;
  SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *__range4;
  SPIRBlock *merge;
  Phi *phi;
  Phi *__end3;
  Phi *__begin3;
  SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *__range3;
  bool ret;
  bool negative_candidate;
  bool positive_candidate;
  bool true_block_is_merge;
  bool false_block_is_merge;
  SPIRBlock *merge_block;
  SPIRBlock *true_block;
  SPIRBlock *false_block;
  Method method_local;
  SPIRBlock *block_local;
  Compiler *this_local;
  
  if (((block->disable_block_optimization & 1U) == 0) && ((block->complex_continue & 1U) == 0)) {
    if ((method == MergeToSelectForLoop) || (method == MergeToSelectContinueForLoop)) {
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->false_block);
      pSVar3 = maybe_get<spirv_cross::SPIRBlock>(this,uVar1);
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->true_block);
      pSVar4 = maybe_get<spirv_cross::SPIRBlock>(this,uVar1);
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->merge_block);
      pSVar5 = maybe_get<spirv_cross::SPIRBlock>(this,uVar1);
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->false_block);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->merge_block);
      local_f1 = true;
      if (uVar1 != uVar2) {
        local_f9 = false;
        if ((pSVar3 != (SPIRBlock *)0x0) && (local_f9 = false, pSVar5 != (SPIRBlock *)0x0)) {
          local_f9 = execution_is_noop(this,pSVar3,pSVar5);
        }
        local_f1 = local_f9;
      }
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->true_block);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->merge_block);
      local_fa = true;
      if (uVar1 != uVar2) {
        local_101 = false;
        if ((pSVar4 != (SPIRBlock *)0x0) && (local_101 = false, pSVar5 != (SPIRBlock *)0x0)) {
          local_101 = execution_is_noop(this,pSVar4,pSVar5);
        }
        local_fa = local_101;
      }
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->true_block);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->merge_block);
      local_102 = false;
      if (uVar1 != uVar2) {
        uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->true_block);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(block->super_IVariant).self);
        local_102 = false;
        if (uVar1 != uVar2) {
          local_102 = local_f1;
        }
      }
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->false_block);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->merge_block);
      local_10d = false;
      if (uVar1 != uVar2) {
        uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->false_block);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(block->super_IVariant).self);
        local_10d = false;
        if (uVar1 != uVar2) {
          local_10d = local_fa;
        }
      }
      local_119 = false;
      if ((*(int *)&(block->super_IVariant).field_0xc == 2) &&
         (local_119 = false, block->merge == MergeLoop)) {
        local_11a = true;
        if (local_102 == false) {
          local_11a = local_10d;
        }
        local_119 = local_11a;
      }
      __range3._3_1_ = local_119;
      if (((local_119 == false) || (local_102 == false)) || (method != MergeToSelectContinueForLoop)
         ) {
        if (((local_119 != false) && (local_10d != false)) &&
           (method == MergeToSelectContinueForLoop)) {
          uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->false_block);
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->continue_block);
          __range3._3_1_ = uVar1 == uVar2;
        }
      }
      else {
        uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->true_block);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->continue_block);
        __range3._3_1_ = uVar1 == uVar2;
      }
      if (__range3._3_1_ != false) {
        __end3 = VectorView<spirv_cross::SPIRBlock::Phi>::begin
                           (&(block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>);
        pPVar6 = VectorView<spirv_cross::SPIRBlock::Phi>::end
                           (&(block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>);
        for (; __end3 != pPVar6; __end3 = __end3 + 1) {
          uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end3->parent);
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(block->super_IVariant).self);
          if (uVar1 == uVar2) {
            return false;
          }
        }
        uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->merge_block);
        pSVar3 = maybe_get<spirv_cross::SPIRBlock>(this,uVar1);
        if (pSVar3 != (SPIRBlock *)0x0) {
          __end4 = VectorView<spirv_cross::SPIRBlock::Phi>::begin
                             (&(pSVar3->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>
                             );
          pPVar6 = VectorView<spirv_cross::SPIRBlock::Phi>::end
                             (&(pSVar3->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>
                             );
          for (; __end4 != pPVar6; __end4 = __end4 + 1) {
            uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end4->parent);
            uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(block->super_IVariant).self)
            ;
            if (uVar1 == uVar2) {
              return false;
            }
          }
        }
      }
      this_local._7_1_ = __range3._3_1_;
    }
    else if (method == MergeToDirectForLoop) {
      local_12d = false;
      if ((*(int *)&(block->super_IVariant).field_0xc == 1) &&
         (local_12d = false, block->merge == MergeLoop)) {
        local_12d = block_is_noop(this,block);
      }
      if (local_12d == false) {
        this_local._7_1_ = false;
      }
      else {
        uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->next_block);
        pSVar3 = get<spirv_cross::SPIRBlock>(this,uVar1);
        uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar3->false_block);
        pSVar4 = maybe_get<spirv_cross::SPIRBlock>(this,uVar1);
        uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar3->true_block);
        pSVar5 = maybe_get<spirv_cross::SPIRBlock>(this,uVar1);
        uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->merge_block);
        to = maybe_get<spirv_cross::SPIRBlock>(this,uVar1);
        uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar3->false_block);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->merge_block);
        local_12e = true;
        if (uVar1 != uVar2) {
          local_135 = false;
          if ((pSVar4 != (SPIRBlock *)0x0) && (local_135 = false, to != (SPIRBlock *)0x0)) {
            local_135 = execution_is_noop(this,pSVar4,to);
          }
          local_12e = local_135;
        }
        uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar3->true_block);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->merge_block);
        local_136 = true;
        if (uVar1 != uVar2) {
          local_13d = false;
          if ((pSVar5 != (SPIRBlock *)0x0) && (local_13d = false, to != (SPIRBlock *)0x0)) {
            local_13d = execution_is_noop(this,pSVar5,to);
          }
          local_136 = local_13d;
        }
        uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar3->true_block);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->merge_block);
        local_13e = false;
        if (uVar1 != uVar2) {
          uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar3->true_block);
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(block->super_IVariant).self);
          local_13e = false;
          if (uVar1 != uVar2) {
            local_13e = local_12e;
          }
        }
        uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar3->false_block);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->merge_block);
        local_149 = false;
        if (uVar1 != uVar2) {
          uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar3->false_block);
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(block->super_IVariant).self);
          local_149 = false;
          if (uVar1 != uVar2) {
            local_149 = local_136;
          }
        }
        local_155 = false;
        if ((*(int *)&(pSVar3->super_IVariant).field_0xc == 2) &&
           (local_155 = false, pSVar3->merge == MergeNone)) {
          local_156 = true;
          if (local_13e == false) {
            local_156 = local_149;
          }
          local_155 = local_156;
        }
        if (local_155 != false) {
          uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->merge_block);
          pSVar4 = maybe_get<spirv_cross::SPIRBlock>(this,uVar1);
          if (pSVar4 != (SPIRBlock *)0x0) {
            __end5 = VectorView<spirv_cross::SPIRBlock::Phi>::begin
                               (&(pSVar4->phi_variables).
                                 super_VectorView<spirv_cross::SPIRBlock::Phi>);
            pPVar6 = VectorView<spirv_cross::SPIRBlock::Phi>::end
                               (&(pSVar4->phi_variables).
                                 super_VectorView<spirv_cross::SPIRBlock::Phi>);
            for (; __end5 != pPVar6; __end5 = __end5 + 1) {
              uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end5->parent);
              uVar2 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(block->super_IVariant).self);
              if (uVar1 == uVar2) {
                return false;
              }
              uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end5->parent);
              uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar3->false_block);
              if (uVar1 == uVar2) {
                return false;
              }
            }
          }
        }
        this_local._7_1_ = local_155;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::block_is_loop_candidate(const SPIRBlock &block, SPIRBlock::Method method) const
{
	// Tried and failed.
	if (block.disable_block_optimization || block.complex_continue)
		return false;

	if (method == SPIRBlock::MergeToSelectForLoop || method == SPIRBlock::MergeToSelectContinueForLoop)
	{
		// Try to detect common for loop pattern
		// which the code backend can use to create cleaner code.
		// for(;;) { if (cond) { some_body; } else { break; } }
		// is the pattern we're looking for.
		const auto *false_block = maybe_get<SPIRBlock>(block.false_block);
		const auto *true_block = maybe_get<SPIRBlock>(block.true_block);
		const auto *merge_block = maybe_get<SPIRBlock>(block.merge_block);

		bool false_block_is_merge = block.false_block == block.merge_block ||
		                            (false_block && merge_block && execution_is_noop(*false_block, *merge_block));

		bool true_block_is_merge = block.true_block == block.merge_block ||
		                           (true_block && merge_block && execution_is_noop(*true_block, *merge_block));

		bool positive_candidate =
		    block.true_block != block.merge_block && block.true_block != block.self && false_block_is_merge;

		bool negative_candidate =
		    block.false_block != block.merge_block && block.false_block != block.self && true_block_is_merge;

		bool ret = block.terminator == SPIRBlock::Select && block.merge == SPIRBlock::MergeLoop &&
		           (positive_candidate || negative_candidate);

		if (ret && positive_candidate && method == SPIRBlock::MergeToSelectContinueForLoop)
			ret = block.true_block == block.continue_block;
		else if (ret && negative_candidate && method == SPIRBlock::MergeToSelectContinueForLoop)
			ret = block.false_block == block.continue_block;

		// If we have OpPhi which depends on branches which came from our own block,
		// we need to flush phi variables in else block instead of a trivial break,
		// so we cannot assume this is a for loop candidate.
		if (ret)
		{
			for (auto &phi : block.phi_variables)
				if (phi.parent == block.self)
					return false;

			auto *merge = maybe_get<SPIRBlock>(block.merge_block);
			if (merge)
				for (auto &phi : merge->phi_variables)
					if (phi.parent == block.self)
						return false;
		}
		return ret;
	}
	else if (method == SPIRBlock::MergeToDirectForLoop)
	{
		// Empty loop header that just sets up merge target
		// and branches to loop body.
		bool ret = block.terminator == SPIRBlock::Direct && block.merge == SPIRBlock::MergeLoop && block_is_noop(block);

		if (!ret)
			return false;

		auto &child = get<SPIRBlock>(block.next_block);

		const auto *false_block = maybe_get<SPIRBlock>(child.false_block);
		const auto *true_block = maybe_get<SPIRBlock>(child.true_block);
		const auto *merge_block = maybe_get<SPIRBlock>(block.merge_block);

		bool false_block_is_merge = child.false_block == block.merge_block ||
		                            (false_block && merge_block && execution_is_noop(*false_block, *merge_block));

		bool true_block_is_merge = child.true_block == block.merge_block ||
		                           (true_block && merge_block && execution_is_noop(*true_block, *merge_block));

		bool positive_candidate =
		    child.true_block != block.merge_block && child.true_block != block.self && false_block_is_merge;

		bool negative_candidate =
		    child.false_block != block.merge_block && child.false_block != block.self && true_block_is_merge;

		ret = child.terminator == SPIRBlock::Select && child.merge == SPIRBlock::MergeNone &&
		      (positive_candidate || negative_candidate);

		if (ret)
		{
			auto *merge = maybe_get<SPIRBlock>(block.merge_block);
			if (merge)
				for (auto &phi : merge->phi_variables)
					if (phi.parent == block.self || phi.parent == child.false_block)
						return false;
		}

		return ret;
	}
	else
		return false;
}